

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseBaseUnresolvedName(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    bVar4 = ParseSimpleId(guard.state_);
    if (bVar4) {
      state_local._7_1_ = true;
    }
    else {
      uVar1 = ((guard.state_)->parse_state).mangled_idx;
      uVar2 = ((guard.state_)->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
      bVar4 = ParseTwoCharToken(guard.state_,"on");
      if ((bVar4) && (bVar4 = ParseOperatorName(guard.state_,(int *)0x0), bVar4)) {
        bVar4 = ParseTemplateArgs(guard.state_);
        bVar4 = Optional(bVar4);
        if (bVar4) {
          state_local._7_1_ = true;
          goto LAB_001098ac;
        }
      }
      ((guard.state_)->parse_state).mangled_idx = uVar1;
      ((guard.state_)->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseTwoCharToken(guard.state_,"dn");
      if ((bVar4) &&
         ((bVar4 = ParseUnresolvedType(guard.state_), bVar4 ||
          (bVar4 = ParseSimpleId(guard.state_), bVar4)))) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        state_local._7_1_ = false;
      }
    }
  }
LAB_001098ac:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseBaseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  if (ParseSimpleId(state)) {
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "on") && ParseOperatorName(state, nullptr) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dn") &&
      (ParseUnresolvedType(state) || ParseSimpleId(state))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}